

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

void __thiscall
Satyricon::SATSolver::remove_from_vect
          (SATSolver *this,
          vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *v,
          ClausePtr c)

{
  pointer *ppWVar1;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *paVar2;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *paVar3;
  
  paVar3 = &((v->
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             )._M_impl.super__Vector_impl_data._M_start)->field_0;
  paVar2 = &((v->
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             )._M_impl.super__Vector_impl_data._M_finish)->field_0;
  while( true ) {
    if (paVar3 == paVar2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                    ,0x246,
                    "void Satyricon::SATSolver::remove_from_vect(vector<Watcher> &, ClausePtr)");
    }
    if (paVar3->clause == c) break;
    paVar3 = paVar3 + 1;
  }
  *paVar3 = paVar2[-1];
  ppWVar1 = &(v->
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *ppWVar1 = *ppWVar1 + -1;
  return;
}

Assistant:

void SATSolver::remove_from_vect( vector<Watcher> &v, ClausePtr c ) {
    for ( auto &i : v ) {
        if ( i.get_clause() == c ) {
            i = v.back();
            v.pop_back();
            return;
        }
    }
    assert(false);
}